

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.hpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DatatypeValidator::isSubstitutableBy
          (DatatypeValidator *this,DatatypeValidator *toCheck)

{
  bool bVar1;
  
  bVar1 = toCheck != (DatatypeValidator *)0x0;
  if (toCheck != this && bVar1) {
    do {
      toCheck = toCheck->fBaseValidator;
      bVar1 = toCheck != (DatatypeValidator *)0x0;
      if (toCheck == this) {
        return bVar1;
      }
    } while (toCheck != (DatatypeValidator *)0x0);
  }
  return bVar1;
}

Assistant:

inline bool
DatatypeValidator::isSubstitutableBy(const DatatypeValidator* const toCheck)
{
    const DatatypeValidator* dv = toCheck;

	while (dv != 0) {

        if (dv == this) {
            return true;
        }

        dv = dv->getBaseValidator();
    }

    return false;
}